

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

uint32_t helper_bcdsr_ppc(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,uint32_t ps)

{
  _Bool _Var1;
  byte bVar2;
  int iVar3;
  undefined1 local_78 [8];
  ppc_avr_t bcd_one;
  int local_5c;
  undefined1 auStack_58 [4];
  int i;
  ppc_avr_t ret;
  int local_40;
  _Bool local_39;
  int sgnb;
  int iStack_34;
  _Bool ox_flag;
  int invalid;
  int unused;
  int cr;
  uint32_t ps_local;
  ppc_avr_t *b_local;
  ppc_avr_t *a_local;
  ppc_avr_t *r_local;
  
  iStack_34 = 0;
  sgnb = 0;
  local_39 = false;
  unused = ps;
  _cr = b;
  b_local = a;
  a_local = r;
  local_40 = bcd_get_sgn(b);
  ret.u64[0] = _cr->u64[1];
  _auStack_58 = _cr->u64[0] & 0xfffffffffffffff0;
  local_5c = (int)b_local->s8[8];
  bcd_one.u64[0] = 0;
  local_78 = (undefined1  [8])0x10;
  _Var1 = bcd_is_valid(_cr);
  if (_Var1) {
    if (local_5c < 0x20) {
      if (local_5c < -0x1f) {
        local_5c = -0x1f;
      }
    }
    else {
      local_5c = 0x1f;
    }
    if (local_5c < 1) {
      urshift((uint64_t *)auStack_58,ret.u64,local_5c * -4);
      bVar2 = bcd_get_digit((ppc_avr_t *)auStack_58,0,&sgnb);
      if (4 < bVar2) {
        bcd_add_mag((ppc_avr_t *)auStack_58,(ppc_avr_t *)auStack_58,(ppc_avr_t *)local_78,&sgnb,
                    &stack0xffffffffffffffcc);
      }
    }
    else {
      ulshift((uint64_t *)auStack_58,ret.u64,local_5c << 2,&local_39);
    }
    iVar3 = bcd_preferred_sgn(local_40,unused);
    bcd_put_digit((ppc_avr_t *)auStack_58,(uint8_t)iVar3,0);
    invalid = bcd_cmp_zero((ppc_avr_t *)auStack_58);
    if ((local_39 & 1U) != 0) {
      invalid = invalid | 1;
    }
    a_local->u64[0] = _auStack_58;
    a_local->u64[1] = ret.u64[0];
    r_local._4_4_ = invalid;
  }
  else {
    r_local._4_4_ = 1;
  }
  return r_local._4_4_;
}

Assistant:

uint32_t helper_bcdsr(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b, uint32_t ps)
{
    int cr;
    int unused = 0;
    int invalid = 0;
    bool ox_flag = false;
    int sgnb = bcd_get_sgn(b);
    ppc_avr_t ret = *b;
    ret.VsrD(1) &= ~0xf;

    int i = a->VsrSB(7);
    ppc_avr_t bcd_one;

    bcd_one.VsrD(0) = 0;
    bcd_one.VsrD(1) = 0x10;

    if (bcd_is_valid(b) == false) {
        return CRF_SO;
    }

    if (unlikely(i > 31)) {
        i = 31;
    } else if (unlikely(i < -31)) {
        i = -31;
    }

    if (i > 0) {
        ulshift(&ret.VsrD(1), &ret.VsrD(0), i * 4, &ox_flag);
    } else {
        urshift(&ret.VsrD(1), &ret.VsrD(0), -i * 4);

        if (bcd_get_digit(&ret, 0, &invalid) >= 5) {
            bcd_add_mag(&ret, &ret, &bcd_one, &invalid, &unused);
        }
    }
    bcd_put_digit(&ret, bcd_preferred_sgn(sgnb, ps), 0);

    cr = bcd_cmp_zero(&ret);
    if (ox_flag) {
        cr |= CRF_SO;
    }
    *r = ret;

    return cr;
}